

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O1

MppTimer mpp_timer_get(char *name)

{
  bool bVar1;
  int __fd;
  int __epfd;
  int iVar2;
  undefined8 *ptr;
  epoll_event event;
  epoll_event local_38;
  
  ptr = (undefined8 *)mpp_osal_calloc("mpp_timer_get",0x48);
  if (ptr == (undefined8 *)0x0) {
    _mpp_log_l(2,"mpp_time","malloc failed\n","mpp_timer_get");
    __fd = -1;
  }
  else {
    __fd = timerfd_create(0,0);
    bVar1 = true;
    if (-1 < __fd) {
      __epfd = epoll_create(1);
      if (-1 < __epfd) {
        local_38.data.fd = 0;
        local_38._4_4_ = __fd;
        local_38.events = 0x80000001;
        iVar2 = epoll_ctl(__epfd,1,__fd,&local_38);
        if (-1 < iVar2) {
          *(int *)((long)ptr + 0x24) = __fd;
          *(int *)(ptr + 5) = __epfd;
          *(undefined8 *)((long)ptr + 0x1c) = 0x3e8000003e8;
          *ptr = "mpp_timer";
          bVar1 = false;
          snprintf((char *)(ptr + 1),0xf,name,0);
        }
      }
      goto LAB_0016d833;
    }
  }
  bVar1 = true;
  __epfd = -1;
LAB_0016d833:
  if (bVar1) {
    _mpp_log_l(2,"mpp_time","failed to create timer\n","mpp_timer_get");
    if (ptr != (undefined8 *)0x0) {
      mpp_osal_free("mpp_timer_get",ptr);
    }
    if (-1 < __fd) {
      close(__fd);
    }
    if (-1 < __epfd) {
      close(__epfd);
    }
    ptr = (undefined8 *)0x0;
  }
  return ptr;
}

Assistant:

MppTimer mpp_timer_get(const char *name)
{
    RK_S32 timer_fd = -1;
    RK_S32 epoll_fd = -1;
    MppTimerImpl *impl = NULL;

    do {
        struct epoll_event event;

        impl = mpp_calloc(MppTimerImpl, 1);
        if (NULL == impl) {
            mpp_err_f("malloc failed\n");
            break;
        }

        timer_fd = timerfd_create(CLOCK_REALTIME, 0);
        if (timer_fd < 0)
            break;

        epoll_fd = epoll_create(1);
        if (epoll_fd < 0)
            break;

        memset(&event, 0, sizeof(event));
        event.data.fd = timer_fd;
        event.events = EPOLLIN | EPOLLET;

        if (epoll_ctl(epoll_fd, EPOLL_CTL_ADD, timer_fd, &event) < 0)
            break;

        impl->timer_fd = timer_fd;
        impl->epoll_fd = epoll_fd;
        /* default 1 second (1000ms) looper */
        impl->initial  = 1000;
        impl->interval = 1000;
        impl->check = timer_name;
        snprintf(impl->name, sizeof(impl->name) - 1, name, NULL);

        return impl;
    } while (0);

    mpp_err_f("failed to create timer\n");

    if (impl) {
        mpp_free(impl);
        impl = NULL;
    }

    if (timer_fd >= 0) {
        close(timer_fd);
        timer_fd = -1;
    }

    if (epoll_fd >= 0) {
        close(epoll_fd);
        epoll_fd = -1;
    }

    return NULL;
}